

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

int anon_unknown.dwarf_3650dd::cmFileUploadProgressCallback
              (void *clientp,cm_curl_off_t dltotal,cm_curl_off_t dlnow,cm_curl_off_t ultotal,
              cm_curl_off_t ulnow)

{
  bool bVar1;
  cmMakefile *this;
  cmMakefile *mf;
  undefined1 local_58 [8];
  string status;
  cURLProgressHelper *helper;
  cm_curl_off_t ulnow_local;
  cm_curl_off_t ultotal_local;
  cm_curl_off_t dlnow_local;
  cm_curl_off_t dltotal_local;
  void *clientp_local;
  
  status.field_2._8_8_ = clientp;
  std::__cxx11::string::string((string *)local_58);
  bVar1 = cURLProgressHelper::UpdatePercentage
                    ((cURLProgressHelper *)status.field_2._8_8_,ulnow,ultotal,(string *)local_58);
  if (bVar1) {
    this = cURLProgressHelper::GetMakefile((cURLProgressHelper *)status.field_2._8_8_);
    cmMakefile::DisplayStatus(this,(string *)local_58,-1.0);
  }
  std::__cxx11::string::~string((string *)local_58);
  return 0;
}

Assistant:

int cmFileUploadProgressCallback(void* clientp, cm_curl_off_t dltotal,
                                 cm_curl_off_t dlnow, cm_curl_off_t ultotal,
                                 cm_curl_off_t ulnow)
{
  cURLProgressHelper* helper = reinterpret_cast<cURLProgressHelper*>(clientp);

  static_cast<void>(dltotal);
  static_cast<void>(dlnow);

  std::string status;
  if (helper->UpdatePercentage(ulnow, ultotal, status)) {
    cmMakefile* mf = helper->GetMakefile();
    mf->DisplayStatus(status, -1);
  }

  return 0;
}